

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

void kj::
     ctor<kj::_::Tuple<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>,kj::Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>>,capnp::Orphan<capnp::compiler::Expression>,capnp::Orphan<capnp::compiler::Expression>,kj::Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>>>,kj::_::Tuple<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>,kj::Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>>,capnp::Orphan<capnp::compiler::Expression>,capnp::Orphan<capnp::compiler::Expression>,kj::Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>>>>
               (Tuple<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>,_kj::Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>_>,_capnp::Orphan<capnp::compiler::Expression>,_capnp::Orphan<capnp::compiler::Expression>,_kj::Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_>
                *location,
               Tuple<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>,_kj::Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>_>,_capnp::Orphan<capnp::compiler::Expression>,_capnp::Orphan<capnp::compiler::Expression>,_kj::Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_>
               *params)

{
  size_t sVar1;
  uint32_t uVar2;
  
  uVar2 = (params->impl).
          super_TupleElement<0U,_capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_>
          .value.endByte;
  (location->impl).
  super_TupleElement<0U,_capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_>.
  value.startByte =
       (params->impl).
       super_TupleElement<0U,_capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_>
       .value.startByte;
  (location->impl).
  super_TupleElement<0U,_capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_>.
  value.endByte = uVar2;
  sVar1 = (params->impl).
          super_TupleElement<0U,_capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_>
          .value.value.super_StringPtr.content.size_;
  (location->impl).
  super_TupleElement<0U,_capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_>.
  value.value.super_StringPtr.content.ptr =
       (params->impl).
       super_TupleElement<0U,_capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_>
       .value.value.super_StringPtr.content.ptr;
  (location->impl).
  super_TupleElement<0U,_capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_>.
  value.value.super_StringPtr.content.size_ = sVar1;
  Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>_>::Maybe
            (&(location->impl).
              super_TupleElement<1U,_kj::Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>_>_>.
              value,&(params->impl).
                     super_TupleElement<1U,_kj::Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>_>_>
                     .value);
  capnp::_::OrphanBuilder::OrphanBuilder
            ((OrphanBuilder *)
             &(location->impl).super_TupleElement<2U,_capnp::Orphan<capnp::compiler::Expression>_>,
             (OrphanBuilder *)
             &(params->impl).super_TupleElement<2U,_capnp::Orphan<capnp::compiler::Expression>_>);
  capnp::_::OrphanBuilder::OrphanBuilder
            ((OrphanBuilder *)
             &(location->impl).super_TupleElement<3U,_capnp::Orphan<capnp::compiler::Expression>_>,
             (OrphanBuilder *)
             &(params->impl).super_TupleElement<3U,_capnp::Orphan<capnp::compiler::Expression>_>);
  (location->impl).
  super_TupleElement<4U,_kj::Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_>
  .value.ptr = (params->impl).
               super_TupleElement<4U,_kj::Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_>
               .value.ptr;
  (location->impl).
  super_TupleElement<4U,_kj::Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_>
  .value.size_ = (params->impl).
                 super_TupleElement<4U,_kj::Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_>
                 .value.size_;
  (location->impl).
  super_TupleElement<4U,_kj::Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_>
  .value.disposer =
       (params->impl).
       super_TupleElement<4U,_kj::Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_>
       .value.disposer;
  (params->impl).
  super_TupleElement<4U,_kj::Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_>
  .value.ptr = (Orphan<capnp::compiler::Declaration::AnnotationApplication> *)0x0;
  (params->impl).
  super_TupleElement<4U,_kj::Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_>
  .value.size_ = 0;
  return;
}

Assistant:

inline void ctor(T& location, Params&&... params) {
  new (_::PlacementNew(), &location) T(kj::fwd<Params>(params)...);
}